

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O3

SUNMemory SUNMemoryNewEmpty(SUNContext_conflict sunctx)

{
  SUNMemory pSVar1;
  
  pSVar1 = (SUNMemory)malloc(0x20);
  pSVar1->bytes = 0;
  pSVar1->stride = 1;
  return pSVar1;
}

Assistant:

SUNMemory SUNMemoryNewEmpty(SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  SUNMemory mem = NULL;

  mem = (SUNMemory)malloc(sizeof(struct SUNMemory_));
  SUNAssertNull(mem, SUN_ERR_MALLOC_FAIL);

  mem->bytes  = 0;
  mem->stride = 1;

  return (mem);
}